

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.h
# Opt level: O0

void __thiscall spvtools::opt::MergeReturnPass::MergeReturnPass(MergeReturnPass *this)

{
  MergeReturnPass *this_local;
  
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__MergeReturnPass_013bebc0;
  std::
  vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
  ::vector(&this->state_);
  this->function_ = (Function *)0x0;
  this->return_flag_ = (Instruction *)0x0;
  this->return_value_ = (Instruction *)0x0;
  this->constant_true_ = (Instruction *)0x0;
  this->final_return_block_ = (BasicBlock *)0x0;
  std::
  unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>_>
  ::unordered_map(&this->original_dominator_);
  std::
  unordered_map<spvtools::opt::BasicBlock_*,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->new_edges_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->return_blocks_);
  return;
}

Assistant:

MergeReturnPass()
      : function_(nullptr),
        return_flag_(nullptr),
        return_value_(nullptr),
        constant_true_(nullptr),
        final_return_block_(nullptr) {}